

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfUdpMulticast.c
# Opt level: O0

sbfUdpMulticast
sbfUdpMulticast_create(sbfUdpMulticastType type,uint32_t interf,sockaddr_in *address)

{
  undefined8 uVar1;
  int iVar2;
  sbfPool psVar3;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  sbfUdpMulticastType in_EDI;
  int opt;
  sockaddr_in sin;
  ip_mreq im;
  in_addr ia;
  sbfUdpMulticast s;
  undefined4 local_40;
  sockaddr local_3c;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  sbfUdpMulticast local_20;
  undefined8 *local_18;
  undefined4 local_10;
  sbfUdpMulticastType local_c;
  
  local_40 = 1;
  local_18 = in_RDX;
  local_10 = in_ESI;
  local_c = in_EDI;
  local_20 = (sbfUdpMulticast)sbfMemory_calloc(1,0x30);
  local_20->mType = local_c;
  psVar3 = (sbfPool)sbfBuffer_createPool1(0x10000,"sbfUdpMulticast_create",0x15);
  local_20->mPool = psVar3;
  uVar1 = *local_18;
  (local_20->mAddress).sin_family = (short)uVar1;
  (local_20->mAddress).sin_port = (short)((ulong)uVar1 >> 0x10);
  (local_20->mAddress).sin_addr = (in_addr)(int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)(local_20->mAddress).sin_zero = local_18[1];
  (local_20->mAddress).sin_family = 2;
  memset(&local_20->mReceiveAddress,0,0x10);
  iVar2 = socket(2,2,0x11);
  local_20->mSocket = iVar2;
  if (-1 < local_20->mSocket) {
    evutil_make_socket_closeonexec(local_20->mSocket);
    evutil_make_socket_nonblocking(local_20->mSocket);
    if (local_c == SBF_UDP_MULTICAST_SEND) {
      memset(&local_24,0,4);
      local_24 = local_10;
      iVar2 = setsockopt(local_20->mSocket,0,0x20,&local_24,4);
      if (-1 < iVar2) {
        return local_20;
      }
    }
    else {
      iVar2 = setsockopt(local_20->mSocket,1,2,&local_40,4);
      if (-1 < iVar2) {
        memset(&local_3c,0,0x10);
        local_3c.sa_family = 2;
        local_3c.sa_data._2_4_ = *(undefined4 *)((long)local_18 + 4);
        local_3c.sa_data._0_2_ = *(undefined2 *)((long)local_18 + 2);
        iVar2 = bind(local_20->mSocket,&local_3c,0x10);
        if (-1 < iVar2) {
          if (0xdf < (*(uint *)((long)local_18 + 4) & 0xff)) {
            memset(&local_2c,0,8);
            local_2c = *(undefined4 *)((long)local_18 + 4);
            local_28 = local_10;
            iVar2 = setsockopt(local_20->mSocket,0,0x23,&local_2c,8);
            if (iVar2 < 0) goto LAB_00103739;
          }
          return local_20;
        }
      }
    }
  }
LAB_00103739:
  sbfUdpMulticast_destroy((sbfUdpMulticast)0x103743);
  return (sbfUdpMulticast)0x0;
}

Assistant:

sbfUdpMulticast
sbfUdpMulticast_create (sbfUdpMulticastType type,
                        uint32_t interf,
                        struct sockaddr_in* address)
{
    sbfUdpMulticast    s;
    struct in_addr     ia;
    struct ip_mreq     im;
    struct sockaddr_in sin;
#ifdef WIN32
    char               opt = 1;
#else
    int                opt = 1;
#endif

    s = xcalloc (1, sizeof *s);
    s->mType = type;
    s->mPool = sbfBuffer_createPool (SBF_UDP_MULTICAST_SIZE_LIMIT);

    memcpy (&s->mAddress, address, sizeof s->mAddress);
    s->mAddress.sin_family = AF_INET;

    memset (&s->mReceiveAddress, 0x0, sizeof s->mReceiveAddress);

    s->mSocket = socket (AF_INET, SOCK_DGRAM, IPPROTO_UDP);
    if (s->mSocket < 0)
        goto fail;
    evutil_make_socket_closeonexec (s->mSocket);
    evutil_make_socket_nonblocking (s->mSocket);

    if (type == SBF_UDP_MULTICAST_SEND)
    {
        memset (&ia, 0, sizeof ia);
        ia.s_addr = interf;
        if (setsockopt (s->mSocket,
                        IPPROTO_IP,
                        IP_MULTICAST_IF,
                        (void*)&ia,
                        sizeof ia) < 0)
            goto fail;
    }
    else
    {
        if (setsockopt (s->mSocket,
                        SOL_SOCKET,
                        SO_REUSEADDR,
                        &opt,
                        sizeof opt) < 0)
            goto fail;

        memset (&sin, 0, sizeof sin);
        sin.sin_family = AF_INET;
#ifdef WIN32
        sin.sin_addr.s_addr = INADDR_ANY;
#else
        sin.sin_addr.s_addr = address->sin_addr.s_addr;
#endif
        sin.sin_port = address->sin_port;
        if (bind (s->mSocket, (struct sockaddr*)&sin, sizeof sin) < 0)
            goto fail;

        if ((address->sin_addr.s_addr & 0xFF) >= 224)
        {
            memset (&im, 0, sizeof im);
            im.imr_multiaddr.s_addr = address->sin_addr.s_addr;
            im.imr_interface.s_addr = interf;
            if (setsockopt (s->mSocket,
                            IPPROTO_IP,
                            IP_ADD_MEMBERSHIP,
                            (void*)&im,
                            sizeof im) < 0)
                goto fail; 
        }
    }

    return s;

fail:
    sbfUdpMulticast_destroy (s);
    return NULL;
}